

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O0

void fadeToBlack(int ledNo,byte fadeValue)

{
  RGB *pRVar1;
  uchar local_30;
  RGB local_1b [2];
  uchar local_13;
  undefined1 local_12;
  undefined1 local_11;
  int value;
  uint8_t b;
  uint8_t g;
  int iStack_c;
  uint8_t r;
  RGB oldColor;
  byte fadeValue_local;
  int ledNo_local;
  
  value._3_1_ = fadeValue;
  iStack_c = ledNo;
  WS2812B::RGB::RGB((RGB *)&value);
  pRVar1 = WS2812B::Led::getColor(&leds,iStack_c);
  value._0_1_ = pRVar1->_r;
  value._1_1_ = pRVar1->_g;
  value._2_1_ = pRVar1->_b;
  local_11 = 0;
  local_12 = 0;
  if (value._2_1_ < 0xb) {
    local_30 = '\0';
  }
  else {
    local_30 = value._2_1_ - (char)(((uint)value._2_1_ * (uint)value._3_1_) / 0x100);
  }
  local_13 = local_30;
  WS2812B::RGB::RGB(local_1b,'\0','\0',local_30);
  WS2812B::Led::setColor(&leds,local_1b,iStack_c);
  return;
}

Assistant:

void fadeToBlack(int ledNo, byte fadeValue) {

    // NeoPixel
    WS2812B::RGB oldColor;
    uint8_t r, g, b;
    int value;

    oldColor = leds.getColor(ledNo);
    r = (oldColor._r & 0x00ff0000UL) >> 16;
    g = (oldColor._g & 0x0000ff00UL) >> 8;
    b = (oldColor._b & 0x000000ffUL);

    r=(r<=10)? 0 : (int) r-(r*fadeValue/256);
    g=(g<=10)? 0 : (int) g-(g*fadeValue/256);
    b=(b<=10)? 0 : (int) b-(b*fadeValue/256);

    leds.setColor(WS2812B::RGB(r,g,b), ledNo);

}